

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool google::protobuf::internal::MergeFromImpl<false>
               (ZeroCopyInputStream *input,MessageLite *msg,TcParseTableBase *tc_table,
               ParseFlags parse_flags)

{
  ParseContext *pPVar1;
  MessageFactory *p;
  MessageLite *pMVar2;
  bool bVar3;
  unsigned_short uVar4;
  int depth;
  uint32_t uVar5;
  TcParseTableBase *pTVar6;
  ulong uVar7;
  TailCallParseFunc p_Var8;
  TcParseTableBase *pTVar9;
  bool local_149;
  undefined1 local_130 [8];
  ParseContext ctx;
  char *ptr;
  ParseFlags parse_flags_local;
  TcParseTableBase *tc_table_local;
  MessageLite *msg_local;
  ZeroCopyInputStream *input_local;
  TcFieldData local_90;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  MessageFactory *local_78;
  MessageLite *local_70;
  MessageFactory *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  msg_local = (MessageLite *)input;
  depth = io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&>
            ((ParseContext *)local_130,depth,false,(char **)&ctx.data_.factory,
             (ZeroCopyInputStream **)&msg_local);
  local_78 = ctx.data_.factory;
  local_80 = (ParseContext *)local_130;
  local_88 = tc_table + 1;
  local_70 = msg;
  while (bVar3 = ParseContext::Done(local_80,(char **)&local_78), pMVar2 = local_70, p = local_78,
        pPVar1 = local_80, ((bVar3 ^ 0xffU) & 1) != 0) {
    TcFieldData::TcFieldData(&local_90);
    pTVar9 = local_88;
    pTVar6 = local_88 + -1;
    uVar4 = UnalignedLoad<unsigned_short>((char *)p);
    uVar7 = (ulong)(int)((uint)uVar4 & (uint)pTVar9[-1].fast_idx_mask);
    if ((uVar7 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   TcParseTableBase::fast_entry(pTVar6,uVar7 >> 3);
    local_58.data =
         (ulong)uVar4 ^
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data.field_0 + 8))->data;
    p_Var8 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data.field_0);
    local_60.data = local_58.data;
    local_78 = (MessageFactory *)(*p_Var8)(pMVar2,(char *)p,pPVar1,(TcFieldData)local_58,pTVar6,0);
    if ((local_78 == (MessageFactory *)0x0) ||
       (uVar5 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar5 != 1))
    break;
  }
  pTVar9 = local_88 + -1;
  if ((local_88[-1].field_0x9 & 1) == 0) {
    local_88 = pTVar9;
    if (local_78 == (MessageFactory *)0x0) {
      TcParser::VerifyHasBitConsistency(local_70,pTVar9);
    }
    local_68 = local_78;
  }
  else {
    pTVar6 = local_88 + -1;
    local_88 = pTVar9;
    local_68 = (MessageFactory *)(*pTVar6->post_loop_handler)(local_70,(char *)local_78,local_80);
  }
  ctx.data_.factory = local_68;
  local_149 = false;
  if (local_68 != (MessageFactory *)0x0) {
    local_149 = EpsCopyInputStream::EndedAtEndOfStream((EpsCopyInputStream *)local_130);
  }
  if (local_149 == false) {
    input_local._7_1_ = false;
  }
  else {
    input_local._7_1_ =
         anon_unknown_15::CheckFieldPresence((ParseContext *)local_130,msg,parse_flags);
  }
  return input_local._7_1_;
}

Assistant:

bool MergeFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  // ctx has no explicit limit (hence we end on end of stream)
  if (ABSL_PREDICT_TRUE(ptr && ctx.EndedAtEndOfStream())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}